

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_1::StringBaseTextGenerator::~StringBaseTextGenerator
          (StringBaseTextGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_BaseTextGenerator)._vptr_BaseTextGenerator =
       (_func_int **)&PTR__StringBaseTextGenerator_004bd4e0;
  pcVar2 = (this->output_)._M_dataplus._M_p;
  paVar1 = &(this->output_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

void Print(const char* text, size_t size) override {
    output_.append(text, size);
  }